

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O1

uhugeint_t __thiscall
duckdb::VectorTryCastStrictOperator<duckdb::TryCast>::Operation<duckdb::string_t,duckdb::uhugeint_t>
          (VectorTryCastStrictOperator<duckdb::TryCast> *this,string_t input,ValidityMask *mask,
          idx_t idx,void *dataptr)

{
  bool bVar1;
  uhugeint_t *result;
  string_t input_00;
  string_t input_01;
  uhugeint_t output;
  uhugeint_t local_60;
  string local_50;
  
  input_01.value._0_8_ = input.value._0_8_;
  result = (uhugeint_t *)(ulong)*(byte *)(*(long *)(idx + 8) + 8);
  input_01.value.pointer.ptr = (char *)&local_60;
  bVar1 = TryCast::Operation<duckdb::string_t,duckdb::uhugeint_t>
                    ((TryCast *)this,input_01,result,SUB81(idx,0));
  if (!bVar1) {
    input_00.value.pointer.ptr = (char *)result;
    input_00.value._0_8_ = input_01.value._0_8_;
    CastExceptionText<duckdb::string_t,duckdb::uhugeint_t>(&local_50,(duckdb *)this,input_00);
    local_60 = HandleVectorCastError::Operation<duckdb::uhugeint_t>
                         (&local_50,input.value._8_8_,(idx_t)mask,(VectorTryCastData *)idx);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return local_60;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output, data->parameters.strict))) {
			return output;
		}
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}